

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

void __thiscall
QMimeXMLProvider::addAliases(QMimeXMLProvider *this,QString *name,QStringList *result)

{
  QKeyValueIterator<const_QString_&,_const_QString_&,_QHash<QString,_QString>::const_iterator> rhs;
  QKeyValueIterator<const_QString_&,_const_QString_&,_QHash<QString,_QString>::const_iterator> lhs;
  bool bVar1;
  QString *rhs_00;
  QKeyValueIterator<const_QString_&,_const_QString_&,_QHash<QString,_QString>::const_iterator>
  *in_RDX;
  long in_FS_OFFSET;
  QString *mimeName;
  QString *alias;
  QKeyValueRange<const_QHash<QString,_QString>_&> *__range1;
  const_key_value_iterator __end1;
  const_key_value_iterator __begin1;
  Data<QHashPrivate::Node<QString,_QString>_> *in_stack_ffffffffffffff70;
  pair<const_QString_&,_const_QString_&> *in_stack_ffffffffffffff78;
  Data<QHashPrivate::Node<QString,_QString>_> *pDVar2;
  pair<const_QString_&,_const_QString_&> local_60;
  Data<QHashPrivate::Node<QString,_QString>_> *local_50;
  size_t local_48;
  Data<QHashPrivate::Node<QString,_QString>_> *local_40;
  size_t local_38;
  piter local_30;
  piter local_20;
  QKeyValueRangeStorage<const_QHash<QString,_QString>_&> local_10;
  size_t local_8;
  
  local_8 = *(size_t *)(in_FS_OFFSET + 0x28);
  local_10.m_map =
       (QHash<QString,_QString> *)
       QHash<QString,_QString>::asKeyValueRange
                 ((QHash<QString,_QString> *)in_stack_ffffffffffffff70);
  pDVar2 = (Data<QHashPrivate::Node<QString,_QString>_> *)&local_10;
  local_20.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d = (Data<QHashPrivate::Node<QString,_QString>_> *)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = (piter)QtPrivate::QKeyValueRange<const_QHash<QString,_QString>_&>::begin
                              ((QKeyValueRange<const_QHash<QString,_QString>_&> *)0x8feab2);
  local_30.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_30.d = (Data<QHashPrivate::Node<QString,_QString>_> *)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = (piter)QtPrivate::QKeyValueRange<const_QHash<QString,_QString>_&>::end
                              ((QKeyValueRange<const_QHash<QString,_QString>_&> *)0x8feae1);
  while( true ) {
    local_40 = local_20.d;
    local_38 = local_20.bucket;
    local_50 = local_30.d;
    local_48 = local_30.bucket;
    lhs.i.i.bucket = (size_t)in_RDX;
    lhs.i.i.d = pDVar2;
    rhs.i.i.bucket = (size_t)in_stack_ffffffffffffff78;
    rhs.i.i.d = in_stack_ffffffffffffff70;
    bVar1 = ::operator!=(lhs,rhs);
    if (!bVar1) break;
    local_60 = QKeyValueIterator<const_QString_&,_const_QString_&,_QHash<QString,_QString>::const_iterator>
               ::operator*(in_RDX);
    in_stack_ffffffffffffff78 = &local_60;
    in_stack_ffffffffffffff70 =
         (Data<QHashPrivate::Node<QString,_QString>_> *)
         std::get<0ul,QString_const&,QString_const&>
                   ((pair<const_QString_&,_const_QString_&> *)0x8feb7e);
    rhs_00 = std::get<1ul,QString_const&,QString_const&>
                       ((pair<const_QString_&,_const_QString_&> *)0x8feb9b);
    bVar1 = ::operator==((QString *)in_stack_ffffffffffffff70,rhs_00);
    if (bVar1) {
      appendIfNew((QStringList *)in_stack_ffffffffffffff70,rhs_00);
    }
    QKeyValueIterator<const_QString_&,_const_QString_&,_QHash<QString,_QString>::const_iterator>::
    operator++((QKeyValueIterator<const_QString_&,_const_QString_&,_QHash<QString,_QString>::const_iterator>
                *)in_stack_ffffffffffffff70);
  }
  if (*(size_t *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMimeXMLProvider::addAliases(const QString &name, QStringList &result)
{
    // Iterate through the whole hash. This method is rarely used.
    for (const auto &[alias, mimeName] : std::as_const(m_aliases).asKeyValueRange()) {
        if (mimeName == name)
            appendIfNew(result, alias);
    }
}